

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void deleteTable(sqlite3 *db,Table *pTable)

{
  Index *pIVar1;
  char *zName;
  Index *pNext;
  Index *pIndex;
  Table *pTable_local;
  sqlite3 *db_local;
  
  pNext = pTable->pIndex;
  while (pNext != (Index *)0x0) {
    pIVar1 = pNext->pNext;
    if ((db->pnBytesFreed == (int *)0x0) && (pTable->eTabType != '\x01')) {
      sqlite3HashInsert(&pNext->pSchema->idxHash,pNext->zName,(void *)0x0);
    }
    sqlite3FreeIndex(db,pNext);
    pNext = pIVar1;
  }
  if (pTable->eTabType == '\0') {
    sqlite3FkDelete(db,pTable);
  }
  else if (pTable->eTabType == '\x01') {
    sqlite3VtabClear(db,pTable);
  }
  else {
    sqlite3SelectDelete(db,(pTable->u).view.pSelect);
  }
  sqlite3DeleteColumnNames(db,pTable);
  sqlite3DbFree(db,pTable->zName);
  sqlite3DbFree(db,pTable->zColAff);
  sqlite3ExprListDelete(db,pTable->pCheck);
  sqlite3DbFree(db,pTable);
  return;
}

Assistant:

static void SQLITE_NOINLINE deleteTable(sqlite3 *db, Table *pTable){
  Index *pIndex, *pNext;

#ifdef SQLITE_DEBUG
  /* Record the number of outstanding lookaside allocations in schema Tables
  ** prior to doing any free() operations. Since schema Tables do not use
  ** lookaside, this number should not change.
  **
  ** If malloc has already failed, it may be that it failed while allocating
  ** a Table object that was going to be marked ephemeral. So do not check
  ** that no lookaside memory is used in this case either. */
  int nLookaside = 0;
  assert( db!=0 );
  if( !db->mallocFailed && (pTable->tabFlags & TF_Ephemeral)==0 ){
    nLookaside = sqlite3LookasideUsed(db, 0);
  }
#endif

  /* Delete all indices associated with this table. */
  for(pIndex = pTable->pIndex; pIndex; pIndex=pNext){
    pNext = pIndex->pNext;
    assert( pIndex->pSchema==pTable->pSchema
         || (IsVirtual(pTable) && pIndex->idxType!=SQLITE_IDXTYPE_APPDEF) );
    if( db->pnBytesFreed==0 && !IsVirtual(pTable) ){
      char *zName = pIndex->zName;
      TESTONLY ( Index *pOld = ) sqlite3HashInsert(
         &pIndex->pSchema->idxHash, zName, 0
      );
      assert( db==0 || sqlite3SchemaMutexHeld(db, 0, pIndex->pSchema) );
      assert( pOld==pIndex || pOld==0 );
    }
    sqlite3FreeIndex(db, pIndex);
  }

  if( IsOrdinaryTable(pTable) ){
    sqlite3FkDelete(db, pTable);
  }
#ifndef SQLITE_OMIT_VIRTUAL_TABLE
  else if( IsVirtual(pTable) ){
    sqlite3VtabClear(db, pTable);
  }
#endif
  else{
    assert( IsView(pTable) );
    sqlite3SelectDelete(db, pTable->u.view.pSelect);
  }